

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt_sse4.c
# Opt level: O1

void av1_get_horver_correlation_full_sse4_1
               (int16_t *diff,int stride,int width,int height,float *hcorr,float *vcorr)

{
  ulong uVar1;
  short sVar2;
  short sVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  long *plVar7;
  short *psVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long *plVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  int iVar26;
  float fVar27;
  float fVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  float fVar32;
  int iVar33;
  int iVar34;
  float fVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  undefined1 auVar39 [16];
  int iVar41;
  undefined1 auVar40 [16];
  float fVar42;
  undefined1 auVar43 [16];
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  
  lVar16 = (long)stride;
  if (height < 4) {
    lVar23 = 0;
    lVar22 = 0;
    lVar25 = 0;
    lVar4 = 0;
  }
  else {
    lVar21 = 0;
    lVar4 = 0;
    lVar25 = 0;
    lVar22 = 0;
    lVar23 = 0;
    plVar14 = (long *)diff;
    do {
      iVar36 = 0;
      iVar37 = 0;
      iVar38 = 0;
      iVar31 = 0;
      iVar33 = 0;
      iVar34 = 0;
      auVar43 = (undefined1  [16])0x0;
      auVar39 = (undefined1  [16])0x0;
      iVar26 = 0;
      iVar29 = 0;
      iVar30 = 0;
      iVar10 = 0;
      iVar6 = 0;
      iVar41 = 0;
      if (3 < width) {
        lVar11 = 0;
        plVar7 = plVar14;
        do {
          lVar17 = *(long *)((long)plVar7 + (long)(stride * 2) * 2);
          auVar46._8_8_ = *plVar7;
          auVar46._0_8_ = lVar17;
          lVar24 = *(long *)((long)plVar7 + lVar16 * 2);
          lVar9 = *(long *)((long)plVar7 + (long)(stride * 3) * 2);
          auVar47._8_8_ = lVar24;
          auVar47._0_8_ = lVar9;
          auVar43._0_8_ = lVar17 << 0x10;
          auVar43._8_8_ = *plVar7 << 0x10;
          auVar48._0_8_ = lVar9 << 0x10;
          auVar48._8_8_ = lVar24 << 0x10;
          auVar45 = pmaddwd(auVar46,auVar43);
          auVar46 = pmaddwd(auVar47,auVar48);
          auVar47 = phaddd(auVar46,auVar45);
          auVar46 = pmaddwd(auVar43,auVar48);
          auVar45._8_8_ = 0;
          auVar45._0_8_ = auVar48._8_8_;
          auVar48 = pmaddwd(auVar43,auVar45);
          auVar48 = phaddd(auVar48,auVar46);
          iVar36 = iVar36 + auVar47._4_4_;
          iVar37 = iVar37 + auVar47._8_4_;
          iVar38 = iVar38 + auVar47._12_4_;
          iVar31 = iVar31 + auVar48._0_4_;
          iVar33 = iVar33 + auVar48._8_4_;
          iVar34 = iVar34 + auVar48._12_4_;
          auVar48 = phaddw(auVar43,auVar43);
          auVar48 = pmovsxwd(auVar48,auVar48);
          auVar46 = pmovsxwd(auVar47,auVar45);
          iVar10 = auVar39._4_4_;
          iVar6 = auVar39._8_4_;
          iVar41 = auVar39._12_4_;
          auVar39._0_4_ = auVar39._0_4_ + auVar46._0_4_ + auVar48._0_4_;
          auVar39._4_4_ = iVar10 + auVar46._4_4_ + auVar48._4_4_;
          auVar39._8_4_ = iVar6 + auVar46._8_4_ + auVar48._8_4_;
          auVar39._12_4_ = iVar41 + auVar46._12_4_ + auVar48._12_4_;
          auVar43 = pmaddwd(auVar43,auVar43);
          auVar48 = pmaddwd(auVar45,auVar45);
          auVar43 = phaddd(auVar43,auVar48);
          iVar26 = iVar26 + auVar43._0_4_;
          iVar29 = iVar29 + auVar43._4_4_;
          iVar30 = iVar30 + auVar43._8_4_;
          lVar11 = lVar11 + 3;
          plVar7 = (long *)((long)plVar7 + 6);
        } while (lVar11 <= width + -4);
        auVar43 = pmovsxdq(auVar43,auVar39);
        auVar40._4_4_ = auVar39._12_4_;
        auVar40._0_4_ = auVar39._8_4_;
        auVar40._8_4_ = auVar39._8_4_;
        auVar40._12_4_ = auVar39._12_4_;
        auVar39 = pmovsxdq(auVar40,auVar40);
        iVar10 = iVar26;
        iVar6 = iVar29;
        iVar41 = iVar30;
      }
      lVar4 = lVar4 + iVar37 + (long)iVar36 + (long)iVar38;
      lVar25 = lVar25 + iVar33 + (long)iVar31 + (long)iVar34;
      lVar22 = lVar22 + auVar43._8_8_ + auVar39._8_8_ + auVar43._0_8_ + auVar39._0_8_;
      lVar23 = lVar23 + iVar6 + (long)iVar10 + (long)iVar41;
      lVar21 = lVar21 + 3;
      plVar14 = (long *)((long)plVar14 + lVar16 * 6);
    } while (lVar21 <= height + -4);
  }
  iVar10 = height % 3;
  if (iVar10 == 1) {
    lVar11 = (long)((height + -1) * stride);
    iVar6 = (int)diff[lVar11];
    lVar21 = (long)iVar6;
    lVar22 = lVar22 + lVar21;
    uVar5 = (ulong)(uint)(iVar6 * iVar6);
    lVar23 = lVar23 + uVar5;
    if (1 < width) {
      uVar19 = 0;
      do {
        sVar2 = diff[lVar11 + uVar19 + 1];
        lVar17 = (long)sVar2;
        lVar4 = lVar4 + diff[lVar11 + uVar19] * lVar17;
        lVar22 = lVar22 + lVar17;
        lVar21 = lVar21 + lVar17;
        uVar13 = (ulong)(uint)((int)sVar2 * (int)sVar2);
        lVar23 = lVar23 + uVar13;
        uVar5 = uVar5 + uVar13;
        uVar19 = uVar19 + 1;
      } while (width - 1 != uVar19);
    }
  }
  else {
    lVar11 = (long)((height + -2) * stride);
    iVar6 = (int)diff[lVar11];
    lVar17 = (long)((height + -1) * stride);
    sVar2 = diff[lVar17];
    lVar21 = (long)sVar2;
    lVar22 = lVar22 + (sVar2 + iVar6);
    uVar20 = (int)sVar2 * (int)sVar2;
    uVar5 = (ulong)uVar20;
    lVar23 = lVar23 + (ulong)(iVar6 * iVar6 + uVar20);
    if (1 < width) {
      uVar19 = 0;
      do {
        iVar6 = (int)diff[lVar11 + uVar19 + 1];
        sVar2 = diff[lVar17 + uVar19 + 1];
        lVar25 = lVar25 + (int)diff[lVar11 + uVar19] * (int)diff[lVar17 + uVar19];
        lVar4 = (long)((int)diff[lVar17 + uVar19] * (int)sVar2) +
                iVar6 * diff[lVar11 + uVar19] + lVar4;
        lVar22 = lVar22 + (sVar2 + iVar6);
        lVar21 = lVar21 + sVar2;
        uVar20 = (int)sVar2 * (int)sVar2;
        lVar23 = lVar23 + (ulong)(iVar6 * iVar6 + uVar20);
        uVar5 = uVar5 + uVar20;
        uVar19 = uVar19 + 1;
      } while (width - 1 != uVar19);
    }
  }
  if (width % 3 == 1) {
    iVar6 = (int)diff[(long)width + -1];
    lVar11 = (long)iVar6;
    lVar22 = lVar22 + lVar11;
    uVar19 = (ulong)(uint)(iVar6 * iVar6);
    lVar23 = lVar23 + uVar19;
    if (1 < height) {
      psVar8 = diff + (long)width + -1;
      uVar13 = 0;
      do {
        sVar2 = *psVar8;
        sVar3 = psVar8[lVar16];
        uVar18 = (ulong)sVar3;
        psVar8 = psVar8 + lVar16;
        lVar25 = lVar25 + (long)sVar2 * uVar18;
        lVar11 = lVar11 + uVar18;
        uVar12 = (ulong)(uint)((int)sVar3 * (int)sVar3);
        uVar19 = uVar19 + uVar12;
        uVar1 = uVar13 + 1;
        if ((long)(int)(((iVar10 == 1) - 3) + height) <= (long)uVar13) {
          uVar18 = 0;
          uVar12 = 0;
        }
        lVar23 = lVar23 + uVar12;
        lVar22 = lVar22 + uVar18;
        uVar13 = uVar1;
      } while (height - 1 != uVar1);
    }
  }
  else {
    iVar6 = (int)diff[(long)width + -2];
    sVar2 = diff[(long)width + -1];
    lVar11 = (long)sVar2;
    lVar22 = lVar22 + (iVar6 + sVar2);
    uVar20 = (int)sVar2 * (int)sVar2;
    uVar19 = (ulong)uVar20;
    lVar23 = lVar23 + (ulong)(iVar6 * iVar6 + uVar20);
    if (1 < height) {
      psVar8 = diff + (long)width + -1;
      uVar13 = 0;
      do {
        iVar6 = (int)psVar8[lVar16 + -1];
        if ((iVar10 == 1) || ((long)uVar13 < (long)(height + -2))) {
          lVar4 = lVar4 + (int)psVar8[-1] * (int)*psVar8;
          lVar25 = lVar25 + psVar8[-1] * iVar6;
        }
        sVar2 = psVar8[lVar16];
        uVar20 = (int)sVar2 * (int)sVar2;
        if ((long)uVar13 < (long)(int)(((iVar10 == 1) - 3) + height)) {
          lVar22 = lVar22 + (sVar2 + iVar6);
          lVar23 = lVar23 + (ulong)(iVar6 * iVar6 + uVar20);
        }
        uVar13 = uVar13 + 1;
        lVar11 = lVar11 + sVar2;
        uVar19 = uVar19 + uVar20;
        lVar25 = lVar25 + (int)*psVar8 * (int)sVar2;
        psVar8 = psVar8 + lVar16;
      } while (height - 1 != uVar13);
    }
  }
  if (width < 1) {
    lVar17 = 0;
    lVar24 = 0;
  }
  else {
    uVar13 = 0;
    lVar24 = 0;
    lVar17 = 0;
    do {
      iVar10 = (int)diff[uVar13];
      lVar24 = lVar24 + iVar10;
      lVar17 = lVar17 + (ulong)(uint)(iVar10 * iVar10);
      uVar13 = uVar13 + 1;
    } while ((uint)width != uVar13);
  }
  if (height < 1) {
    lVar9 = 0;
    lVar15 = 0;
  }
  else {
    uVar13 = (ulong)(uint)height;
    lVar15 = 0;
    lVar9 = 0;
    do {
      iVar10 = (int)*diff;
      lVar9 = lVar9 + iVar10;
      lVar15 = lVar15 + (ulong)(uint)(iVar10 * iVar10);
      diff = diff + lVar16;
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
  }
  lVar11 = lVar22 - lVar11;
  fVar32 = (float)((width + -1) * height);
  lVar21 = lVar22 - lVar21;
  fVar42 = (float)((height + -1) * width);
  fVar27 = (float)(long)(lVar23 - uVar19) - (float)(lVar11 * lVar11) / fVar32;
  fVar44 = (float)(long)(lVar23 - uVar5) - (float)(lVar21 * lVar21) / fVar42;
  fVar28 = 1.0;
  if (0.0 < fVar27) {
    lVar9 = lVar22 - lVar9;
    fVar35 = (float)(lVar23 - lVar15) - (float)(lVar9 * lVar9) / fVar32;
    fVar28 = 1.0;
    if (0.0 < fVar35) {
      fVar27 = fVar27 * fVar35;
      if (fVar27 < 0.0) {
        fVar27 = sqrtf(fVar27);
      }
      else {
        fVar27 = SQRT(fVar27);
      }
      fVar27 = ((float)lVar4 - (float)(lVar9 * lVar11) / fVar32) / fVar27;
      *hcorr = fVar27;
      fVar28 = 0.0;
      if (0.0 <= fVar27) {
        fVar28 = fVar27;
      }
    }
  }
  fVar27 = 1.0;
  *hcorr = fVar28;
  if (0.0 < fVar44) {
    lVar22 = lVar22 - lVar24;
    fVar28 = (float)(lVar23 - lVar17) - (float)(lVar22 * lVar22) / fVar42;
    if (0.0 < fVar28) {
      fVar44 = fVar44 * fVar28;
      if (fVar44 < 0.0) {
        fVar44 = sqrtf(fVar44);
      }
      else {
        fVar44 = SQRT(fVar44);
      }
      fVar44 = ((float)lVar25 - (float)(lVar22 * lVar21) / fVar42) / fVar44;
      *vcorr = fVar44;
      fVar27 = 0.0;
      if (0.0 <= fVar44) {
        fVar27 = fVar44;
      }
    }
  }
  *vcorr = fVar27;
  return;
}

Assistant:

void av1_get_horver_correlation_full_sse4_1(const int16_t *diff, int stride,
                                            int width, int height, float *hcorr,
                                            float *vcorr) {
  // The following notation is used:
  // x - current pixel
  // y - right neighbour pixel
  // z - below neighbour pixel
  // w - down-right neighbour pixel
  int64_t xy_sum = 0, xz_sum = 0;
  int64_t x_sum = 0, x2_sum = 0;

  // Process horizontal and vertical correlations through the body in 4x4
  // blocks.  This excludes the final row and column and possibly one extra
  // column depending how 3 divides into width and height
  int32_t xy_tmp[4] = { 0 }, xz_tmp[4] = { 0 };
  int32_t x_tmp[4] = { 0 }, x2_tmp[4] = { 0 };
  __m128i xy_sum_32 = _mm_setzero_si128();
  __m128i xz_sum_32 = _mm_setzero_si128();
  __m128i x_sum_32 = _mm_setzero_si128();
  __m128i x2_sum_32 = _mm_setzero_si128();
  for (int i = 0; i <= height - 4; i += 3) {
    for (int j = 0; j <= width - 4; j += 3) {
      horver_correlation_4x4(&diff[i * stride + j], stride, &xy_sum_32,
                             &xz_sum_32, &x_sum_32, &x2_sum_32);
    }
    xx_storeu_128(xy_tmp, xy_sum_32);
    xx_storeu_128(xz_tmp, xz_sum_32);
    xx_storeu_128(x_tmp, x_sum_32);
    xx_storeu_128(x2_tmp, x2_sum_32);
    xy_sum += (int64_t)xy_tmp[3] + xy_tmp[2] + xy_tmp[1];
    xz_sum += (int64_t)xz_tmp[3] + xz_tmp[2] + xz_tmp[0];
    x_sum += (int64_t)x_tmp[3] + x_tmp[2] + x_tmp[1] + x_tmp[0];
    x2_sum += (int64_t)x2_tmp[2] + x2_tmp[1] + x2_tmp[0];
    xy_sum_32 = _mm_setzero_si128();
    xz_sum_32 = _mm_setzero_si128();
    x_sum_32 = _mm_setzero_si128();
    x2_sum_32 = _mm_setzero_si128();
  }

  // x_sum now covers every pixel except the final 1-2 rows and 1-2 cols
  int64_t x_finalrow = 0, x_finalcol = 0, x2_finalrow = 0, x2_finalcol = 0;

  // Do we have 2 rows remaining or just the one?  Note that width and height
  // are powers of 2, so each modulo 3 must be 1 or 2.
  if (height % 3 == 1) {  // Just horiz corrs on the final row
    const int16_t x0 = diff[(height - 1) * stride];
    x_sum += x0;
    x_finalrow += x0;
    x2_sum += x0 * x0;
    x2_finalrow += x0 * x0;
    for (int j = 0; j < width - 1; ++j) {
      const int16_t x = diff[(height - 1) * stride + j];
      const int16_t y = diff[(height - 1) * stride + j + 1];
      xy_sum += x * y;
      x_sum += y;
      x2_sum += y * y;
      x_finalrow += y;
      x2_finalrow += y * y;
    }
  } else {  // Two rows remaining to do
    const int16_t x0 = diff[(height - 2) * stride];
    const int16_t z0 = diff[(height - 1) * stride];
    x_sum += x0 + z0;
    x2_sum += x0 * x0 + z0 * z0;
    x_finalrow += z0;
    x2_finalrow += z0 * z0;
    for (int j = 0; j < width - 1; ++j) {
      const int16_t x = diff[(height - 2) * stride + j];
      const int16_t y = diff[(height - 2) * stride + j + 1];
      const int16_t z = diff[(height - 1) * stride + j];
      const int16_t w = diff[(height - 1) * stride + j + 1];

      // Horizontal and vertical correlations for the penultimate row:
      xy_sum += x * y;
      xz_sum += x * z;

      // Now just horizontal correlations for the final row:
      xy_sum += z * w;

      x_sum += y + w;
      x2_sum += y * y + w * w;
      x_finalrow += w;
      x2_finalrow += w * w;
    }
  }

  // Do we have 2 columns remaining or just the one?
  if (width % 3 == 1) {  // Just vert corrs on the final col
    const int16_t x0 = diff[width - 1];
    x_sum += x0;
    x_finalcol += x0;
    x2_sum += x0 * x0;
    x2_finalcol += x0 * x0;
    for (int i = 0; i < height - 1; ++i) {
      const int16_t x = diff[i * stride + width - 1];
      const int16_t z = diff[(i + 1) * stride + width - 1];
      xz_sum += x * z;
      x_finalcol += z;
      x2_finalcol += z * z;
      // So the bottom-right elements don't get counted twice:
      if (i < height - (height % 3 == 1 ? 2 : 3)) {
        x_sum += z;
        x2_sum += z * z;
      }
    }
  } else {  // Two cols remaining
    const int16_t x0 = diff[width - 2];
    const int16_t y0 = diff[width - 1];
    x_sum += x0 + y0;
    x2_sum += x0 * x0 + y0 * y0;
    x_finalcol += y0;
    x2_finalcol += y0 * y0;
    for (int i = 0; i < height - 1; ++i) {
      const int16_t x = diff[i * stride + width - 2];
      const int16_t y = diff[i * stride + width - 1];
      const int16_t z = diff[(i + 1) * stride + width - 2];
      const int16_t w = diff[(i + 1) * stride + width - 1];

      // Horizontal and vertical correlations for the penultimate col:
      // Skip these on the last iteration of this loop if we also had two
      // rows remaining, otherwise the final horizontal and vertical correlation
      // get erroneously processed twice
      if (i < height - 2 || height % 3 == 1) {
        xy_sum += x * y;
        xz_sum += x * z;
      }

      x_finalcol += w;
      x2_finalcol += w * w;
      // So the bottom-right elements don't get counted twice:
      if (i < height - (height % 3 == 1 ? 2 : 3)) {
        x_sum += z + w;
        x2_sum += z * z + w * w;
      }

      // Now just vertical correlations for the final column:
      xz_sum += y * w;
    }
  }

  // Calculate the simple sums and squared-sums
  int64_t x_firstrow = 0, x_firstcol = 0;
  int64_t x2_firstrow = 0, x2_firstcol = 0;

  for (int j = 0; j < width; ++j) {
    x_firstrow += diff[j];
    x2_firstrow += diff[j] * diff[j];
  }
  for (int i = 0; i < height; ++i) {
    x_firstcol += diff[i * stride];
    x2_firstcol += diff[i * stride] * diff[i * stride];
  }

  int64_t xhor_sum = x_sum - x_finalcol;
  int64_t xver_sum = x_sum - x_finalrow;
  int64_t y_sum = x_sum - x_firstcol;
  int64_t z_sum = x_sum - x_firstrow;
  int64_t x2hor_sum = x2_sum - x2_finalcol;
  int64_t x2ver_sum = x2_sum - x2_finalrow;
  int64_t y2_sum = x2_sum - x2_firstcol;
  int64_t z2_sum = x2_sum - x2_firstrow;

  const float num_hor = (float)(height * (width - 1));
  const float num_ver = (float)((height - 1) * width);

  const float xhor_var_n = x2hor_sum - (xhor_sum * xhor_sum) / num_hor;
  const float xver_var_n = x2ver_sum - (xver_sum * xver_sum) / num_ver;

  const float y_var_n = y2_sum - (y_sum * y_sum) / num_hor;
  const float z_var_n = z2_sum - (z_sum * z_sum) / num_ver;

  const float xy_var_n = xy_sum - (xhor_sum * y_sum) / num_hor;
  const float xz_var_n = xz_sum - (xver_sum * z_sum) / num_ver;

  if (xhor_var_n > 0 && y_var_n > 0) {
    *hcorr = xy_var_n / sqrtf(xhor_var_n * y_var_n);
    *hcorr = *hcorr < 0 ? 0 : *hcorr;
  } else {
    *hcorr = 1.0;
  }
  if (xver_var_n > 0 && z_var_n > 0) {
    *vcorr = xz_var_n / sqrtf(xver_var_n * z_var_n);
    *vcorr = *vcorr < 0 ? 0 : *vcorr;
  } else {
    *vcorr = 1.0;
  }
}